

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::IfBlock(SQCompiler *this)

{
  SQObjectType SVar1;
  SQInteger SVar2;
  SQObjectValue arg2;
  long *in_RDI;
  SQObject SVar3;
  SQFuncState *unaff_retaddr;
  SQInteger oldouters;
  SQInteger in_stack_00000018;
  SQScope __oldscope__;
  SQInteger in_stack_00000070;
  SQCompiler *in_stack_00000078;
  bool in_stack_000000df;
  SQCompiler *in_stack_000000e0;
  SQCompiler *in_stack_ffffffffffffffd0;
  long lVar4;
  undefined4 in_stack_ffffffffffffffdc;
  long arg1;
  long arg0;
  long *plVar5;
  SQOpcode _op;
  
  if (*in_RDI == 0x7b) {
    arg1 = in_RDI[0x1d];
    arg0 = in_RDI[0x1e];
    in_RDI[0x1d] = *(long *)(in_RDI[1] + 0x1c8);
    plVar5 = in_RDI;
    SVar2 = SQFuncState::GetStackSize((SQFuncState *)0x12a8b3);
    _op = (SQOpcode)((ulong)plVar5 >> 0x20);
    in_RDI[0x1e] = SVar2;
    Lex(in_stack_ffffffffffffffd0);
    Statements(in_stack_ffffffffffffffd0);
    SVar3 = Expect(in_stack_00000078,in_stack_00000070);
    arg2 = SVar3._unVal;
    SVar1 = SVar3._type;
    lVar4 = *(long *)(in_RDI[1] + 0x1c8);
    SVar2 = SQFuncState::GetStackSize((SQFuncState *)0x12a902);
    if ((SVar2 != in_RDI[0x1e]) &&
       (SQFuncState::SetStackSize((SQFuncState *)__oldscope__.outers,in_stack_00000018),
       lVar4 != *(long *)(in_RDI[1] + 0x1c8))) {
      SQFuncState::AddInstruction
                (unaff_retaddr,_op,arg0,arg1,arg2.nInteger,CONCAT44(in_stack_ffffffffffffffdc,SVar1)
                );
    }
    in_RDI[0x1d] = arg1;
    in_RDI[0x1e] = arg0;
  }
  else {
    Statement(in_stack_000000e0,in_stack_000000df);
    if ((in_RDI[7] != 0x7d) && (in_RDI[7] != 0x3b)) {
      OptionalSemicolon(in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void IfBlock()
    {
        if (_token == _SC('{'))
        {
            BEGIN_SCOPE();
            Lex();
            Statements();
            Expect(_SC('}'));
            if (true) {
                END_SCOPE();
            }
            else {
                END_SCOPE_NO_CLOSE();
            }
        }
        else {
            Statement();
            if (_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
        }
    }